

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatProcessor.cpp
# Opt level: O1

void __thiscall
cali::FormatProcessor::FormatProcessorImpl::create_formatter
          (FormatProcessorImpl *this,QuerySpec *spec)

{
  Expand *this_00;
  
  if ((spec->format).opt == Default) {
    this_00 = (Expand *)operator_new(0x18);
    (this_00->super_Formatter)._vptr_Formatter = (_func_int **)&PTR__CaliFormatter_0027a878;
    CaliWriter::CaliWriter((CaliWriter *)&this_00->mP,&this->m_stream);
  }
  else {
    switch((spec->format).formatter.id) {
    case 0:
      this_00 = (Expand *)operator_new(0x18);
      (this_00->super_Formatter)._vptr_Formatter = (_func_int **)&PTR__CaliFormatter_0027a878;
      CaliWriter::CaliWriter((CaliWriter *)&this_00->mP,&this->m_stream);
      break;
    case 1:
      this_00 = (Expand *)operator_new(0x18);
      JsonFormatter::JsonFormatter((JsonFormatter *)this_00,&this->m_stream,spec);
      break;
    case 2:
      this_00 = (Expand *)operator_new(0x18);
      Expand::Expand(this_00,&this->m_stream,spec);
      break;
    case 3:
      this_00 = (Expand *)operator_new(0x18);
      UserFormatter::UserFormatter((UserFormatter *)this_00,&this->m_stream,spec);
      break;
    case 4:
      this_00 = (Expand *)operator_new(0x18);
      TableFormatter::TableFormatter((TableFormatter *)this_00,spec);
      break;
    case 5:
      this_00 = (Expand *)operator_new(0x18);
      TreeFormatter::TreeFormatter((TreeFormatter *)this_00,spec);
      break;
    case 6:
      this_00 = (Expand *)operator_new(0x18);
      JsonSplitFormatter::JsonSplitFormatter((JsonSplitFormatter *)this_00,spec);
      break;
    default:
      goto switchD_001ac2f2_default;
    }
  }
  this->m_formatter = &this_00->super_Formatter;
switchD_001ac2f2_default:
  return;
}

Assistant:

void create_formatter(const QuerySpec& spec)
    {
        if (spec.format.opt == QuerySpec::FormatSpec::Default) {
            m_formatter = new CaliFormatter(m_stream);
        } else {
            switch (spec.format.formatter.id) {
            case FormatterID::Cali:
                m_formatter = new CaliFormatter(m_stream);
                break;
            case FormatterID::Json:
                m_formatter = new JsonFormatter(m_stream, spec);
                break;
            case FormatterID::Expand:
                m_formatter = new Expand(m_stream, spec);
                break;
            case FormatterID::Format:
                m_formatter = new UserFormatter(m_stream, spec);
                break;
            case FormatterID::Table:
                m_formatter = new TableFormatter(spec);
                break;
            case FormatterID::Tree:
                m_formatter = new TreeFormatter(spec);
                break;
            case FormatterID::JsonSplit:
                m_formatter = new JsonSplitFormatter(spec);
                break;
            }
        }
    }